

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.c
# Opt level: O1

void DrawEllipse(int centerX,int centerY,float radiusH,float radiusV,Color color)

{
  uint uVar1;
  bool bVar2;
  float x;
  float y;
  float fVar3;
  float fVar4;
  
  rlCheckRenderBatchLimit(0x6c);
  rlBegin(4);
  x = (float)centerX;
  y = (float)centerY;
  uVar1 = 0;
  do {
    rlColor4ub(color.r,color.g,color.b,color.a);
    rlVertex2f(x,y);
    fVar3 = sinf((float)(int)uVar1 * 0.017453292);
    fVar4 = cosf((float)(int)uVar1 * 0.017453292);
    rlVertex2f(fVar3 * radiusH + x,fVar4 * radiusV + y);
    fVar3 = (float)(int)(uVar1 + 10) * 0.017453292;
    fVar4 = sinf(fVar3);
    fVar3 = cosf(fVar3);
    rlVertex2f(fVar4 * radiusH + x,fVar3 * radiusV + y);
    bVar2 = uVar1 < 0x15e;
    uVar1 = uVar1 + 10;
  } while (bVar2);
  rlEnd();
  return;
}

Assistant:

void DrawEllipse(int centerX, int centerY, float radiusH, float radiusV, Color color)
{
    rlCheckRenderBatchLimit(3*36);

    rlBegin(RL_TRIANGLES);
        for (int i = 0; i < 360; i += 10)
        {
            rlColor4ub(color.r, color.g, color.b, color.a);
            rlVertex2f((float)centerX, (float)centerY);
            rlVertex2f((float)centerX + sinf(DEG2RAD*i)*radiusH, (float)centerY + cosf(DEG2RAD*i)*radiusV);
            rlVertex2f((float)centerX + sinf(DEG2RAD*(i + 10))*radiusH, (float)centerY + cosf(DEG2RAD*(i + 10))*radiusV);
        }
    rlEnd();
}